

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  int __errnum;
  TValue *pTVar1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  long in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  int en;
  int local_10;
  
  if (in_ESI == 0) {
    piVar2 = __errno_location();
    __errnum = *piVar2;
    pTVar1 = in_RDI->top;
    in_RDI->top = pTVar1 + 1;
    (pTVar1->field_2).it = 0xffffffff;
    if (in_RDX == 0) {
      pcVar3 = strerror(__errnum);
      lua_pushfstring(in_RDI,"%s",pcVar3);
    }
    else {
      pcVar3 = strerror(__errnum);
      lua_pushfstring(in_RDI,"%s: %s",in_RDX,pcVar3);
    }
    pTVar1 = in_RDI->top;
    in_RDI->top = pTVar1 + 1;
    pTVar1->n = (double)__errnum;
    uVar4 = (ulong)(in_RDI->glref).ptr32;
    *(uint *)(uVar4 + 0x31c) = *(uint *)(uVar4 + 0x31c) & 0xffffffef;
    local_10 = 3;
  }
  else {
    pTVar1 = in_RDI->top;
    in_RDI->top = pTVar1 + 1;
    (pTVar1->field_2).it = 0xfffffffd;
    local_10 = 1;
  }
  return local_10;
}

Assistant:

LUALIB_API int luaL_fileresult(lua_State *L, int stat, const char *fname)
{
  if (stat) {
    setboolV(L->top++, 1);
    return 1;
  } else {
    int en = errno;  /* Lua API calls may change this value. */
    setnilV(L->top++);
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, strerror(en));
    else
      lua_pushfstring(L, "%s", strerror(en));
    setintV(L->top++, en);
    lj_trace_abort(G(L));
    return 3;
  }
}